

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this)

{
  uint uVar1;
  uint uVar2;
  Fad<Fad<double>_> *pFVar3;
  Fad<Fad<double>_> *pFVar4;
  uint uVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  
  pFVar3 = this->left_;
  pFVar4 = this->right_;
  __return_storage_ptr__->val_ = (pFVar3->val_).val_ + (pFVar4->val_).val_;
  uVar1 = (pFVar3->val_).dx_.num_elts;
  uVar2 = (pFVar4->val_).dx_.num_elts;
  uVar5 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar5 = uVar1;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar5 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar5;
    pdVar6 = (double *)operator_new__((ulong)uVar5 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar6;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar7 = (pFVar3->val_).dx_.ptr_to_data;
    pdVar8 = (pFVar4->val_).dx_.ptr_to_data;
    uVar9 = 0;
    do {
      pdVar10 = pdVar7;
      if (uVar1 == 0) {
        pdVar10 = &(pFVar3->val_).defaultVal;
      }
      pdVar11 = pdVar8;
      if (uVar2 == 0) {
        pdVar11 = &(pFVar4->val_).defaultVal;
      }
      pdVar6[uVar9] = *pdVar10 + *pdVar11;
      uVar9 = uVar9 + 1;
      pdVar8 = pdVar8 + 1;
      pdVar7 = pdVar7 + 1;
    } while (uVar5 != uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}